

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::TrimObject
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header,size_t sizeOfObject,
          bool inDispose)

{
  undefined4 *puVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  IdleDecommitPageAllocator *this_00;
  LargeObjectHeader *pLVar6;
  LargeObjectHeader *address;
  ulong uVar7;
  undefined8 *in_FS_OFFSET;
  
  this_00 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this->heapInfo);
  if (((this->allocCount < 2) && (((this->super_HeapBlock).isForceSweeping & 1U) == 0)) &&
     (!inDispose)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x6d2,"(this->allocCount > 1 || this->isForceSweeping || inDispose)",
                       "this->allocCount > 1 || this->isForceSweeping || inDispose");
    if (!bVar4) goto LAB_00269051;
    *puVar1 = 0;
  }
  if (sizeOfObject < 0x1001) {
    bVar4 = false;
  }
  else {
    uVar7 = ((this->super_HeapBlock).segment)->segmentPageCount;
    uVar5 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::GetMaxAllocPageCount(&this_00->super_PageAllocator);
    if (uVar5 < uVar7) {
      return false;
    }
    if (this->allocCount < 2) {
      return false;
    }
    if (this->hadTrimmed == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x6de,"(!this->hadTrimmed)","!this->hadTrimmed");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    sVar2 = header->objectSize;
    if ((LargeObjectHeader *)(this->super_HeapBlock).address != header) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x6f8,"(objectAddress == this->address)","objectAddress == this->address")
      ;
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    if (header->objectIndex != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x6f9,"(header->objectIndex == 0)","header->objectIndex == 0");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    pLVar6 = (LargeObjectHeader *)((long)&header[1].objectIndex + sVar2);
    address = (LargeObjectHeader *)((ulong)pLVar6 & 0xfffffffffffff000);
    if (address < header) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x6fb,"(objectFreeAddress <= objectFreeEndAddress)",
                         "objectFreeAddress <= objectFreeEndAddress");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    uVar7 = (long)address - (long)header;
    if (address != pLVar6 && sizeOfObject + 0x20 <= uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x6fc,
                         "(bytesToFree < sizeOfObject + sizeof(LargeObjectHeader) || (uintptr_t) objectEndAddress == objectFreeEndAddress)"
                         ,
                         "bytesToFree < sizeOfObject + sizeof(LargeObjectHeader) || (uintptr_t) objectEndAddress == objectFreeEndAddress"
                        );
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    if (address == header) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x702,"(bytesToFree > 0)","bytesToFree > 0");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    if ((uVar7 & 0xfff) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x703,"((bytesToFree & (AutoSystemInfo::PageSize - 1)) == 0)",
                         "(bytesToFree & (AutoSystemInfo::PageSize - 1)) == 0");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    if (uVar7 < 0x1000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x705,"(freePageCount > 0)","freePageCount > 0");
      if (!bVar4) goto LAB_00269051;
      *puVar1 = 0;
    }
    uVar7 = uVar7 >> 0xc;
    if (this->pageCount <= uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x706,"(freePageCount < this->pageCount)",
                         "freePageCount < this->pageCount");
      if (!bVar4) {
LAB_00269051:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    if (inDispose) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&this_00->super_PageAllocator);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::Release(&this_00->super_PageAllocator,header,uVar7,(this->super_HeapBlock).segment);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&this_00->super_PageAllocator);
    }
    else {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::Release(&this_00->super_PageAllocator,header,uVar7,(this->super_HeapBlock).segment);
    }
    HeapBlockMap64::ClearHeapBlock(&recycler->heapBlockMap,(this->super_HeapBlock).address,uVar7);
    (this->super_HeapBlock).address = (char *)address;
    this->pageCount = this->pageCount - uVar7;
    FillFreeMemory(this,recycler,address,(long)pLVar6 - (long)address);
    this->hadTrimmed = true;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool
LargeHeapBlock::TrimObject(Recycler* recycler, LargeObjectHeader* header, size_t sizeOfObject, bool inDispose)
{
    IdleDecommitPageAllocator* pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    uint pageSize = AutoSystemInfo::PageSize ;

    // If we have to trim an object, either we need to have more than one object in the
    // heap block or we're being called as a part of force-sweep or dispose
    Assert(this->allocCount > 1 || this->isForceSweeping || inDispose);

    // If we have more than 1 page of bytes to free
    // make sure that the number of bytes doesn't exceed the cap for a PageSegment
    // since this optimization can only be applied to heap blocks using page segments.
    // We also skip this optimization if the allocCount is 1 since that means
    // the heap block is empty and we've been called only because we're force sweeping.
    // So, skip the opt since we're going to be marking the heap block as empty soon
    if (sizeOfObject > pageSize &&
        this->segment->GetPageCount() <= pageAllocator->GetMaxAllocPageCount() &&
        this->allocCount > 1)
    {
        Assert(!this->hadTrimmed);

        // We want to decommit the free pages beyond 4K (the page size)
        // The way large allocations work is that at most we can have 4 objects in a large heap block
        // The first object can span multiple pages, the remaining 3 objects must all fit within a page
        // So if the object being freed is greater than 1 page, then it must be the first object
        // The objectIndex must be 0 and the header must be same as this->address
        // The end address is (baseAddress + objectSize) & ~(4k - 1)
        // The number of pages to free is (freePageEnd - freePageStart) / pageSize

        char* objectAddress = (char*) header;
        char* objectEndAddress = objectAddress + sizeof(LargeObjectHeader) + header->objectSize;

        uintptr_t alignmentMask = ~((uintptr_t) (AutoSystemInfo::PageSize - 1));

        uintptr_t objectFreeAddress = (uintptr_t) objectAddress;
        uintptr_t objectFreeEndAddress = ((uintptr_t) objectEndAddress) & alignmentMask;

        size_t bytesToFree = (objectFreeEndAddress - objectFreeAddress);

        // Verify assumptions
        // Make sure that the object being freed is the first object since
        // the expectation in a large heap block is that the first object is the largest
        // object.
        // The amount of bytes to free is always less than the size of the object being freed including its header
        // The exception is if the original object's size + header size is a multiple of the page size
        Assert(objectAddress == this->address);
        Assert(header->objectIndex == 0);
        Assert(objectFreeEndAddress <= (uintptr_t) objectEndAddress);
        Assert(objectFreeAddress <= objectFreeEndAddress);
        Assert(bytesToFree < sizeOfObject + sizeof(LargeObjectHeader) || (uintptr_t) objectEndAddress == objectFreeEndAddress);

        // If we actually have something to free, release those pages
        // Move the heap block to start from the new start address
        // Change the heap block map to contain an entry for only the pages that haven't been freed
        // Fill up the old object's unreleased memory if we have to
        Assert(bytesToFree > 0);
        Assert((bytesToFree & (AutoSystemInfo::PageSize - 1)) == 0);
        size_t freePageCount = bytesToFree / AutoSystemInfo::PageSize;
        Assert(freePageCount > 0);
        Assert(freePageCount < this->pageCount);

        // If this call to trim needs idle decommit to be suspended (e.g. dispose case)
        // check if IdleDecommit has been suspended already. If it hasn't, suspend it
        // This is to prevent reentrant idle decommits (e.g. sometimes dispose is called with
        if (inDispose)
        {
            pageAllocator->SuspendIdleDecommit();
        }

        pageAllocator->Release((char*) objectFreeAddress, freePageCount, this->GetSegment());

        if (inDispose)
        {
            pageAllocator->ResumeIdleDecommit();
        }

        // Remove the freed pages from the heap block map
        // and move the heap block to start from after the pages that were freed
        // and update the page count
        recycler->heapBlockMap.ClearHeapBlock(this->address, freePageCount);

        this->address = (char*) objectFreeEndAddress;
        this->pageCount -= freePageCount;

        FillFreeMemory(recycler, (void*) objectFreeEndAddress, (size_t) (objectEndAddress - objectFreeEndAddress));

#if DBG
        this->hadTrimmed = true;
#endif
        return true;
    }

    return false;
}